

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O3

void Fraig_NodeSimulate(Fraig_Node_t *pNode,int iWordStart,int iWordStop,int fUseRand)

{
  uint uVar1;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t *pFVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigNode.c"
                  ,0xe8,"void Fraig_NodeSimulate(Fraig_Node_t *, int, int, int)");
  }
  uVar8 = (ulong)(fUseRand == 0);
  pFVar2 = pNode->p1;
  pFVar3 = pNode->p2;
  if (((ulong)pFVar2 & 1) == 0) {
    uVar9 = *(uint *)&pFVar2->field_0x18;
  }
  else {
    uVar9 = ~*(uint *)(((ulong)pFVar2 & 0xfffffffffffffffe) + 0x18);
  }
  uVar9 = uVar9 & 1;
  if (((ulong)pFVar3 & 1) == 0) {
    uVar10 = *(uint *)&pFVar3->field_0x18;
  }
  else {
    uVar10 = ~*(uint *)(((ulong)pFVar3 & 0xfffffffffffffffe) + 0x18);
  }
  uVar10 = uVar10 & 1;
  puVar4 = (&pNode->puSimR)[uVar8];
  lVar5 = *(long *)(((ulong)pFVar2 & 0xfffffffffffffffe) + 0x68 + uVar8 * 8);
  lVar6 = *(long *)(((ulong)pFVar3 & 0xfffffffffffffffe) + 0x68 + uVar8 * 8);
  uVar1 = *(uint *)&pNode->field_0x18;
  if ((uVar9 == 0) || (uVar10 == 0)) {
    if ((uVar9 == 0) || (uVar10 != 0)) {
      if ((uVar9 == 0) && (uVar10 != 0)) {
        if ((uVar1 & 1) == 0) {
          if (iWordStart < iWordStop) {
            lVar7 = (long)iWordStart;
            uVar9 = 0;
            do {
              uVar10 = ~*(uint *)(lVar6 + lVar7 * 4) & *(uint *)(lVar5 + lVar7 * 4);
              puVar4[lVar7] = uVar10;
              uVar9 = uVar9 ^ uVar10 * s_FraigPrimes[lVar7];
              lVar7 = lVar7 + 1;
            } while (iWordStop != lVar7);
            goto LAB_005c2c1e;
          }
        }
        else if (iWordStart < iWordStop) {
          lVar7 = (long)iWordStart;
          uVar9 = 0;
          do {
            uVar10 = ~*(uint *)(lVar5 + lVar7 * 4) | *(uint *)(lVar6 + lVar7 * 4);
            puVar4[lVar7] = uVar10;
            uVar9 = uVar9 ^ uVar10 * s_FraigPrimes[lVar7];
            lVar7 = lVar7 + 1;
          } while (iWordStop != lVar7);
          goto LAB_005c2c1e;
        }
      }
      else if ((uVar1 & 1) == 0) {
        if (iWordStart < iWordStop) {
          lVar7 = (long)iWordStart;
          uVar9 = 0;
          do {
            uVar10 = *(uint *)(lVar6 + lVar7 * 4) & *(uint *)(lVar5 + lVar7 * 4);
            puVar4[lVar7] = uVar10;
            uVar9 = uVar9 ^ uVar10 * s_FraigPrimes[lVar7];
            lVar7 = lVar7 + 1;
          } while (iWordStop != lVar7);
          goto LAB_005c2c1e;
        }
      }
      else if (iWordStart < iWordStop) {
        lVar7 = (long)iWordStart;
        uVar9 = 0;
        do {
          uVar10 = ~(*(uint *)(lVar6 + lVar7 * 4) & *(uint *)(lVar5 + lVar7 * 4));
          puVar4[lVar7] = uVar10;
          uVar9 = uVar9 ^ uVar10 * s_FraigPrimes[lVar7];
          lVar7 = lVar7 + 1;
        } while (iWordStop != lVar7);
        goto LAB_005c2c1e;
      }
    }
    else if ((uVar1 & 1) == 0) {
      if (iWordStart < iWordStop) {
        lVar7 = (long)iWordStart;
        uVar9 = 0;
        do {
          uVar10 = ~*(uint *)(lVar5 + lVar7 * 4) & *(uint *)(lVar6 + lVar7 * 4);
          puVar4[lVar7] = uVar10;
          uVar9 = uVar9 ^ uVar10 * s_FraigPrimes[lVar7];
          lVar7 = lVar7 + 1;
        } while (iWordStop != lVar7);
        goto LAB_005c2c1e;
      }
    }
    else if (iWordStart < iWordStop) {
      lVar7 = (long)iWordStart;
      uVar9 = 0;
      do {
        uVar10 = ~*(uint *)(lVar6 + lVar7 * 4) | *(uint *)(lVar5 + lVar7 * 4);
        puVar4[lVar7] = uVar10;
        uVar9 = uVar9 ^ uVar10 * s_FraigPrimes[lVar7];
        lVar7 = lVar7 + 1;
      } while (iWordStop != lVar7);
      goto LAB_005c2c1e;
    }
  }
  else if ((uVar1 & 1) == 0) {
    if (iWordStart < iWordStop) {
      lVar7 = (long)iWordStart;
      uVar9 = 0;
      do {
        uVar10 = ~(*(uint *)(lVar6 + lVar7 * 4) | *(uint *)(lVar5 + lVar7 * 4));
        puVar4[lVar7] = uVar10;
        uVar9 = uVar9 ^ uVar10 * s_FraigPrimes[lVar7];
        lVar7 = lVar7 + 1;
      } while (iWordStop != lVar7);
      goto LAB_005c2c1e;
    }
  }
  else if (iWordStart < iWordStop) {
    lVar7 = (long)iWordStart;
    uVar9 = 0;
    do {
      uVar10 = *(uint *)(lVar6 + lVar7 * 4) | *(uint *)(lVar5 + lVar7 * 4);
      puVar4[lVar7] = uVar10;
      uVar9 = uVar9 ^ uVar10 * s_FraigPrimes[lVar7];
      lVar7 = lVar7 + 1;
    } while (iWordStop != lVar7);
    goto LAB_005c2c1e;
  }
  uVar9 = 0;
LAB_005c2c1e:
  if (fUseRand == 0) {
    pNode->uHashD = pNode->uHashD ^ uVar9;
  }
  else {
    pNode->uHashR = pNode->uHashR ^ uVar9;
  }
  return;
}

Assistant:

void Fraig_NodeSimulate( Fraig_Node_t * pNode, int iWordStart, int iWordStop, int fUseRand )
{
    unsigned * pSims, * pSims1, * pSims2;
    unsigned uHash;
    int fCompl, fCompl1, fCompl2, i;

    assert( !Fraig_IsComplement(pNode) );

    // get hold of the simulation information
    pSims  = fUseRand? pNode->puSimR                    : pNode->puSimD;
    pSims1 = fUseRand? Fraig_Regular(pNode->p1)->puSimR : Fraig_Regular(pNode->p1)->puSimD;
    pSims2 = fUseRand? Fraig_Regular(pNode->p2)->puSimR : Fraig_Regular(pNode->p2)->puSimD;

    // get complemented attributes of the children using their random info
    fCompl  = pNode->fInv;
    fCompl1 = Fraig_NodeIsSimComplement(pNode->p1);
    fCompl2 = Fraig_NodeIsSimComplement(pNode->p2);

    // simulate
    uHash = 0;
    if ( fCompl1 && fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = ~(pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else if ( fCompl1 && !fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] | ~pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (~pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else if ( !fCompl1 && fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (~pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] & ~pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else // if ( !fCompl1 && !fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = ~(pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }

    if ( fUseRand )
        pNode->uHashR ^= uHash;
    else
        pNode->uHashD ^= uHash;
}